

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O1

void __thiscall read_slot_1::operator()(read_slot_1 *this,wm_slot_le **_slot,xr_reader *r)

{
  uint *puVar1;
  wm_slot_le *value;
  ulong __n;
  read_wallmark local_89;
  wm_object local_88;
  
  value = (wm_slot_le *)operator_new(0x58);
  (value->shader)._M_dataplus._M_p = (pointer)&(value->shader).field_2;
  (value->shader)._M_string_length = 0;
  (value->shader).field_2._M_local_buf[0] = '\0';
  (value->texture)._M_dataplus._M_p = (pointer)&(value->texture).field_2;
  (value->texture)._M_string_length = 0;
  (value->texture).field_2._M_local_buf[0] = '\0';
  (value->wallmarks).super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->wallmarks).super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_slot = value;
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  __n = (ulong)*puVar1;
  xray_re::xr_reader::r_sz(r,(string *)value);
  xray_re::xr_reader::r_sz(r,&value->texture);
  std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::reserve
            (&value->wallmarks,__n);
  if (__n != 0) {
    do {
      local_88.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.height = 0.0;
      local_88.rotate = 0.0;
      local_88.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.bsphere.p.field_0._4_8_ = 0;
      local_88.bsphere.r = 0.0;
      local_88.width = 0.0;
      local_88.bbox.field_0._12_8_ = 0;
      local_88._24_8_ = 0;
      local_88._0_8_ = 0;
      local_88.bbox.field_0._4_8_ = 0;
      std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::
      emplace_back<xray_re::wm_object>(&value->wallmarks,&local_88);
      if (local_88.vertices.
          super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.vertices.
                        super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.vertices.
                              super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.vertices.
                              super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      __n = __n - 1;
      read_wallmark::operator()
                (&local_89,
                 (value->wallmarks).
                 super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1,r);
    } while (__n != 0);
  }
  return;
}

Assistant:

void operator()(wm_slot_le*& _slot, xr_reader& r) const {
	wm_slot_le* slot = new wm_slot_le;
	_slot = slot;
	size_t n = r.r_u32();
	r.r_sz(slot->shader);
	r.r_sz(slot->texture);
	r.r_seq(n, slot->wallmarks, read_wallmark());
}